

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

void __thiscall
icu_63::NFRuleSet::setDecimalFormatSymbols
          (NFRuleSet *this,DecimalFormatSymbols *newSymbols,UErrorCode *status)

{
  NFRule *newRule;
  int32_t nonNumericalIdx;
  ulong uVar1;
  long lVar2;
  uint32_t fIdx;
  
  if ((this->rules).fCount != 0) {
    uVar1 = 0;
    do {
      NFRule::setDecimalFormatSymbols((this->rules).fStuff[uVar1],newSymbols,status);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->rules).fCount);
  }
  lVar2 = 1;
  do {
    if ((this->nonNumericalRules[lVar2] != (NFRule *)0x0) && ((this->fractionRules).fCount != 0)) {
      uVar1 = 0;
      do {
        newRule = (this->fractionRules).fStuff[uVar1];
        if (this->nonNumericalRules[lVar2]->baseValue == newRule->baseValue) {
          setBestFractionRule(this,(int32_t)lVar2,newRule,'\0');
        }
        uVar1 = uVar1 + 1;
      } while (uVar1 < (this->fractionRules).fCount);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    if (this->nonNumericalRules[lVar2] != (NFRule *)0x0) {
      NFRule::setDecimalFormatSymbols(this->nonNumericalRules[lVar2],newSymbols,status);
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  return;
}

Assistant:

void
NFRuleSet::setDecimalFormatSymbols(const DecimalFormatSymbols &newSymbols, UErrorCode& status) {
    for (uint32_t i = 0; i < rules.size(); ++i) {
        rules[i]->setDecimalFormatSymbols(newSymbols, status);
    }
    // Switch the fraction rules to mirror the DecimalFormatSymbols.
    for (int32_t nonNumericalIdx = IMPROPER_FRACTION_RULE_INDEX; nonNumericalIdx <= MASTER_RULE_INDEX; nonNumericalIdx++) {
        if (nonNumericalRules[nonNumericalIdx]) {
            for (uint32_t fIdx = 0; fIdx < fractionRules.size(); fIdx++) {
                NFRule *fractionRule = fractionRules[fIdx];
                if (nonNumericalRules[nonNumericalIdx]->getBaseValue() == fractionRule->getBaseValue()) {
                    setBestFractionRule(nonNumericalIdx, fractionRule, FALSE);
                }
            }
        }
    }

    for (uint32_t nnrIdx = 0; nnrIdx < NON_NUMERICAL_RULE_LENGTH; nnrIdx++) {
        NFRule *rule = nonNumericalRules[nnrIdx];
        if (rule) {
            rule->setDecimalFormatSymbols(newSymbols, status);
        }
    }
}